

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

LPVOID GetNativeContextSP(native_context_t *context)

{
  return (LPVOID)(context->uc_mcontext).gregs[0xf];
}

Assistant:

LPVOID GetNativeContextSP(const native_context_t *context)
{
#ifdef _AMD64_
    return (LPVOID)MCREG_Rsp(context->uc_mcontext);
#elif defined(_X86_)
    return (LPVOID) MCREG_Esp(context->uc_mcontext);
#elif defined(HOST_S390X)
    return (LPVOID) MCREG_R15(context->uc_mcontext);
#elif defined(HOST_POWERPC64)
    return (LPVOID) MCREG_R31(context->uc_mcontext);
#else
    return (LPVOID) MCREG_Sp(context->uc_mcontext);
#endif
}